

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccolor.c
# Opt level: O2

void rgb_ycc_convert(j_compress_ptr cinfo,JSAMPARRAY input_buf,JSAMPIMAGE output_buf,
                    JDIMENSION output_row,int num_rows)

{
  uint uVar1;
  JSAMPROW pJVar2;
  _func_void_j_compress_ptr *p_Var3;
  JSAMPROW pJVar4;
  JSAMPROW pJVar5;
  JSAMPROW pJVar6;
  byte *pbVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  switch(cinfo->in_color_space) {
  case JCS_EXT_RGB:
    p_Var3 = cinfo->cconvert[1].start_pass;
    uVar1 = cinfo->image_width;
    while (0 < num_rows) {
      num_rows = num_rows + -1;
      pbVar7 = *input_buf;
      pJVar4 = (*output_buf)[output_row];
      pJVar5 = output_buf[1][output_row];
      pJVar6 = output_buf[2][output_row];
      for (uVar10 = 0; uVar1 != uVar10; uVar10 = uVar10 + 1) {
        uVar11 = (ulong)*pbVar7;
        uVar8 = (ulong)pbVar7[1];
        uVar9 = (ulong)pbVar7[2];
        pJVar4[uVar10] =
             (JSAMPLE)((uint)(*(int *)(p_Var3 + uVar8 * 8 + 0x800) + *(int *)(p_Var3 + uVar11 * 8) +
                             *(int *)(p_Var3 + uVar9 * 8 + 0x1000)) >> 0x10);
        pJVar5[uVar10] =
             (JSAMPLE)((uint)(*(int *)(p_Var3 + uVar8 * 8 + 0x2000) +
                              *(int *)(p_Var3 + uVar11 * 8 + 0x1800) +
                             *(int *)(p_Var3 + uVar9 * 8 + 0x2800)) >> 0x10);
        pJVar6[uVar10] =
             (JSAMPLE)((uint)(*(int *)(p_Var3 + uVar8 * 8 + 0x3000) +
                              *(int *)(p_Var3 + uVar11 * 8 + 0x2800) +
                             *(int *)(p_Var3 + uVar9 * 8 + 0x3800)) >> 0x10);
        pbVar7 = pbVar7 + 3;
      }
      input_buf = input_buf + 1;
      output_row = output_row + 1;
    }
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    p_Var3 = cinfo->cconvert[1].start_pass;
    uVar1 = cinfo->image_width;
    while (0 < num_rows) {
      num_rows = num_rows + -1;
      pJVar4 = *input_buf;
      pJVar5 = (*output_buf)[output_row];
      pJVar6 = output_buf[1][output_row];
      pJVar2 = output_buf[2][output_row];
      for (uVar10 = 0; uVar1 != uVar10; uVar10 = uVar10 + 1) {
        uVar11 = (ulong)pJVar4[uVar10 * 4];
        uVar8 = (ulong)pJVar4[uVar10 * 4 + 1];
        uVar9 = (ulong)pJVar4[uVar10 * 4 + 2];
        pJVar5[uVar10] =
             (JSAMPLE)((uint)(*(int *)(p_Var3 + uVar8 * 8 + 0x800) + *(int *)(p_Var3 + uVar11 * 8) +
                             *(int *)(p_Var3 + uVar9 * 8 + 0x1000)) >> 0x10);
        pJVar6[uVar10] =
             (JSAMPLE)((uint)(*(int *)(p_Var3 + uVar8 * 8 + 0x2000) +
                              *(int *)(p_Var3 + uVar11 * 8 + 0x1800) +
                             *(int *)(p_Var3 + uVar9 * 8 + 0x2800)) >> 0x10);
        pJVar2[uVar10] =
             (JSAMPLE)((uint)(*(int *)(p_Var3 + uVar8 * 8 + 0x3000) +
                              *(int *)(p_Var3 + uVar11 * 8 + 0x2800) +
                             *(int *)(p_Var3 + uVar9 * 8 + 0x3800)) >> 0x10);
      }
      input_buf = input_buf + 1;
      output_row = output_row + 1;
    }
    break;
  case JCS_EXT_BGR:
    p_Var3 = cinfo->cconvert[1].start_pass;
    uVar1 = cinfo->image_width;
    while (0 < num_rows) {
      num_rows = num_rows + -1;
      pJVar4 = (*output_buf)[output_row];
      pJVar5 = output_buf[1][output_row];
      pJVar6 = output_buf[2][output_row];
      pbVar7 = *input_buf + 2;
      for (uVar10 = 0; uVar1 != uVar10; uVar10 = uVar10 + 1) {
        uVar11 = (ulong)*pbVar7;
        uVar8 = (ulong)pbVar7[-1];
        uVar9 = (ulong)pbVar7[-2];
        pJVar4[uVar10] =
             (JSAMPLE)((uint)(*(int *)(p_Var3 + uVar8 * 8 + 0x800) + *(int *)(p_Var3 + uVar11 * 8) +
                             *(int *)(p_Var3 + uVar9 * 8 + 0x1000)) >> 0x10);
        pJVar5[uVar10] =
             (JSAMPLE)((uint)(*(int *)(p_Var3 + uVar8 * 8 + 0x2000) +
                              *(int *)(p_Var3 + uVar11 * 8 + 0x1800) +
                             *(int *)(p_Var3 + uVar9 * 8 + 0x2800)) >> 0x10);
        pJVar6[uVar10] =
             (JSAMPLE)((uint)(*(int *)(p_Var3 + uVar8 * 8 + 0x3000) +
                              *(int *)(p_Var3 + uVar11 * 8 + 0x2800) +
                             *(int *)(p_Var3 + uVar9 * 8 + 0x3800)) >> 0x10);
        pbVar7 = pbVar7 + 3;
      }
      input_buf = input_buf + 1;
      output_row = output_row + 1;
    }
    break;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    p_Var3 = cinfo->cconvert[1].start_pass;
    uVar1 = cinfo->image_width;
    while (0 < num_rows) {
      num_rows = num_rows + -1;
      pJVar4 = *input_buf;
      pJVar5 = (*output_buf)[output_row];
      pJVar6 = output_buf[1][output_row];
      pJVar2 = output_buf[2][output_row];
      for (uVar10 = 0; uVar1 != uVar10; uVar10 = uVar10 + 1) {
        uVar11 = (ulong)pJVar4[uVar10 * 4 + 2];
        uVar8 = (ulong)pJVar4[uVar10 * 4 + 1];
        uVar9 = (ulong)pJVar4[uVar10 * 4];
        pJVar5[uVar10] =
             (JSAMPLE)((uint)(*(int *)(p_Var3 + uVar8 * 8 + 0x800) + *(int *)(p_Var3 + uVar11 * 8) +
                             *(int *)(p_Var3 + uVar9 * 8 + 0x1000)) >> 0x10);
        pJVar6[uVar10] =
             (JSAMPLE)((uint)(*(int *)(p_Var3 + uVar8 * 8 + 0x2000) +
                              *(int *)(p_Var3 + uVar11 * 8 + 0x1800) +
                             *(int *)(p_Var3 + uVar9 * 8 + 0x2800)) >> 0x10);
        pJVar2[uVar10] =
             (JSAMPLE)((uint)(*(int *)(p_Var3 + uVar8 * 8 + 0x3000) +
                              *(int *)(p_Var3 + uVar11 * 8 + 0x2800) +
                             *(int *)(p_Var3 + uVar9 * 8 + 0x3800)) >> 0x10);
      }
      input_buf = input_buf + 1;
      output_row = output_row + 1;
    }
    break;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    p_Var3 = cinfo->cconvert[1].start_pass;
    uVar1 = cinfo->image_width;
    while (0 < num_rows) {
      num_rows = num_rows + -1;
      pJVar4 = *input_buf;
      pJVar5 = (*output_buf)[output_row];
      pJVar6 = output_buf[1][output_row];
      pJVar2 = output_buf[2][output_row];
      for (uVar10 = 0; uVar1 != uVar10; uVar10 = uVar10 + 1) {
        uVar11 = (ulong)pJVar4[uVar10 * 4 + 3];
        uVar8 = (ulong)pJVar4[uVar10 * 4 + 2];
        uVar9 = (ulong)pJVar4[uVar10 * 4 + 1];
        pJVar5[uVar10] =
             (JSAMPLE)((uint)(*(int *)(p_Var3 + uVar8 * 8 + 0x800) + *(int *)(p_Var3 + uVar11 * 8) +
                             *(int *)(p_Var3 + uVar9 * 8 + 0x1000)) >> 0x10);
        pJVar6[uVar10] =
             (JSAMPLE)((uint)(*(int *)(p_Var3 + uVar8 * 8 + 0x2000) +
                              *(int *)(p_Var3 + uVar11 * 8 + 0x1800) +
                             *(int *)(p_Var3 + uVar9 * 8 + 0x2800)) >> 0x10);
        pJVar2[uVar10] =
             (JSAMPLE)((uint)(*(int *)(p_Var3 + uVar8 * 8 + 0x3000) +
                              *(int *)(p_Var3 + uVar11 * 8 + 0x2800) +
                             *(int *)(p_Var3 + uVar9 * 8 + 0x3800)) >> 0x10);
      }
      input_buf = input_buf + 1;
      output_row = output_row + 1;
    }
    break;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    p_Var3 = cinfo->cconvert[1].start_pass;
    uVar1 = cinfo->image_width;
    while (0 < num_rows) {
      num_rows = num_rows + -1;
      pJVar4 = *input_buf;
      pJVar5 = (*output_buf)[output_row];
      pJVar6 = output_buf[1][output_row];
      pJVar2 = output_buf[2][output_row];
      for (uVar10 = 0; uVar1 != uVar10; uVar10 = uVar10 + 1) {
        uVar11 = (ulong)pJVar4[uVar10 * 4 + 1];
        uVar8 = (ulong)pJVar4[uVar10 * 4 + 2];
        uVar9 = (ulong)pJVar4[uVar10 * 4 + 3];
        pJVar5[uVar10] =
             (JSAMPLE)((uint)(*(int *)(p_Var3 + uVar8 * 8 + 0x800) + *(int *)(p_Var3 + uVar11 * 8) +
                             *(int *)(p_Var3 + uVar9 * 8 + 0x1000)) >> 0x10);
        pJVar6[uVar10] =
             (JSAMPLE)((uint)(*(int *)(p_Var3 + uVar8 * 8 + 0x2000) +
                              *(int *)(p_Var3 + uVar11 * 8 + 0x1800) +
                             *(int *)(p_Var3 + uVar9 * 8 + 0x2800)) >> 0x10);
        pJVar2[uVar10] =
             (JSAMPLE)((uint)(*(int *)(p_Var3 + uVar8 * 8 + 0x3000) +
                              *(int *)(p_Var3 + uVar11 * 8 + 0x2800) +
                             *(int *)(p_Var3 + uVar9 * 8 + 0x3800)) >> 0x10);
      }
      input_buf = input_buf + 1;
      output_row = output_row + 1;
    }
    break;
  default:
    p_Var3 = cinfo->cconvert[1].start_pass;
    uVar1 = cinfo->image_width;
    while (0 < num_rows) {
      num_rows = num_rows + -1;
      pbVar7 = *input_buf;
      pJVar4 = (*output_buf)[output_row];
      pJVar5 = output_buf[1][output_row];
      pJVar6 = output_buf[2][output_row];
      for (uVar10 = 0; uVar1 != uVar10; uVar10 = uVar10 + 1) {
        uVar11 = (ulong)*pbVar7;
        uVar8 = (ulong)pbVar7[1];
        uVar9 = (ulong)pbVar7[2];
        pJVar4[uVar10] =
             (JSAMPLE)((uint)(*(int *)(p_Var3 + uVar8 * 8 + 0x800) + *(int *)(p_Var3 + uVar11 * 8) +
                             *(int *)(p_Var3 + uVar9 * 8 + 0x1000)) >> 0x10);
        pJVar5[uVar10] =
             (JSAMPLE)((uint)(*(int *)(p_Var3 + uVar8 * 8 + 0x2000) +
                              *(int *)(p_Var3 + uVar11 * 8 + 0x1800) +
                             *(int *)(p_Var3 + uVar9 * 8 + 0x2800)) >> 0x10);
        pJVar6[uVar10] =
             (JSAMPLE)((uint)(*(int *)(p_Var3 + uVar8 * 8 + 0x3000) +
                              *(int *)(p_Var3 + uVar11 * 8 + 0x2800) +
                             *(int *)(p_Var3 + uVar9 * 8 + 0x3800)) >> 0x10);
        pbVar7 = pbVar7 + 3;
      }
      input_buf = input_buf + 1;
      output_row = output_row + 1;
    }
  }
  return;
}

Assistant:

METHODDEF(void)
rgb_ycc_convert(j_compress_ptr cinfo, JSAMPARRAY input_buf,
                JSAMPIMAGE output_buf, JDIMENSION output_row, int num_rows)
{
  switch (cinfo->in_color_space) {
  case JCS_EXT_RGB:
    extrgb_ycc_convert_internal(cinfo, input_buf, output_buf, output_row,
                                num_rows);
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    extrgbx_ycc_convert_internal(cinfo, input_buf, output_buf, output_row,
                                 num_rows);
    break;
  case JCS_EXT_BGR:
    extbgr_ycc_convert_internal(cinfo, input_buf, output_buf, output_row,
                                num_rows);
    break;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    extbgrx_ycc_convert_internal(cinfo, input_buf, output_buf, output_row,
                                 num_rows);
    break;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    extxbgr_ycc_convert_internal(cinfo, input_buf, output_buf, output_row,
                                 num_rows);
    break;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    extxrgb_ycc_convert_internal(cinfo, input_buf, output_buf, output_row,
                                 num_rows);
    break;
  default:
    rgb_ycc_convert_internal(cinfo, input_buf, output_buf, output_row,
                             num_rows);
    break;
  }
}